

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Registry.cpp
# Opt level: O1

MakeFunctions * SoapySDR::Registry::listMakeFunctions_abi_cxx11_(void)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  mapped_type *pp_Var3;
  _Rb_tree_node_base *p_Var4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SoapySDR::Device_*(*)(const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SoapySDR::Device_*(*)(const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>_>
  *in_RDI;
  
  p_Var1 = &(in_RDI->_M_t)._M_impl.super__Rb_tree_header;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  getFunctionTable_abi_cxx11_();
  for (p_Var4 = getFunctionTable[abi:cxx11]()::table_abi_cxx11_._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left;
      (_Rb_tree_header *)p_Var4 !=
      &getFunctionTable[abi:cxx11]()::table_abi_cxx11_._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    p_Var2 = p_Var4[3]._M_parent;
    pp_Var3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SoapySDR::Device_*(*)(const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SoapySDR::Device_*(*)(const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>_>
              ::operator[](in_RDI,(key_type *)(p_Var4 + 1));
    *pp_Var3 = (mapped_type)p_Var2;
  }
  return in_RDI;
}

Assistant:

SoapySDR::MakeFunctions SoapySDR::Registry::listMakeFunctions(void)
{
    MakeFunctions functions;
    for (const auto &it : getFunctionTable())
    {
        functions[it.first] = it.second.make;
    }
    return functions;
}